

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall sing::ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  element_type *peVar2;
  thread *thread;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  lock_guard<std::mutex> lock;
  ThreadPool *this_local;
  
  lock._M_device = (mutex_type *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range2,&peVar2->mutex);
    peVar2 = std::
             __shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar2->stop = true;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
  }
  std::__shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this);
  std::condition_variable::notify_all();
  __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->threads);
  thread = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->threads);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&thread), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads);
  std::shared_ptr<sing::ThreadPool::poolData>::~shared_ptr(&this->pool_);
  return;
}

Assistant:

~ThreadPool(){//pool_对象是线程池的成员，池析构时会调用pool对象的析构，这里表现为减少智能指针的引用计数
        if ((bool)pool_)
        {
            std::lock_guard<std::mutex> lock(pool_->mutex);
            pool_->stop = true;
        }
        pool_->cond.notify_all();
for(auto& thread:threads){
    thread.join();
}       
    }